

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O2

void fak_c(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  solver_state_c s;
  
  setup_simple_state_c(&two_dof_robot_c,&s);
  *(undefined4 *)s.q = 0;
  *(undefined4 *)((long)s.q + 4) = 0x3ff00000;
  *(undefined4 *)(s.q + 1) = 0;
  *(undefined4 *)((long)s.q + 0xc) = 0x3ff00000;
  *(undefined4 *)s.qd = 0;
  *(undefined4 *)((long)s.qd + 4) = 0x3ff00000;
  *(undefined4 *)(s.qd + 1) = 0;
  *(undefined4 *)((long)s.qd + 0xc) = 0x3ff00000;
  *(undefined4 *)s.qdd = 0;
  *(undefined4 *)((long)s.qdd + 4) = 0x3ff00000;
  *(undefined4 *)(s.qdd + 1) = 0;
  *(undefined4 *)((long)s.qdd + 0xc) = 0x3ff00000;
  lVar2 = 0x10;
  lVar5 = 0;
  lVar4 = lVar2;
  for (lVar1 = 1; lVar1 <= s.nbody; lVar1 = lVar1 + 1) {
    lVar6 = _gc_acc_twist_accumulate + lVar2;
    lVar3 = (long)*(int *)(_gc_acc_twist_accumulate + lVar2) * 0x40;
    (**(code **)(&kcc_joint + lVar3))(lVar6,(long)s.q + lVar5,(long)&s.x_jnt[-1].rotation + lVar4);
    gc_pose_compose((long)&s.x_jnt[-1].rotation + lVar4,_gc_acc_twist_accumulate + lVar2 + -0x10,
                    (long)&s.x_rel[-1].rotation + lVar4);
    (**(code **)(gc_acc_twist_tf_ref_to_tgt + lVar3))
              (lVar6,(long)s.qd + lVar5,(long)&s.xd_jnt[-1].angular_velocity + lVar4);
    gc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].rotation + lVar4,(long)&s.xd[-1].angular_velocity + lVar4,
               (long)&s.xd_tf[-1].angular_velocity + lVar4);
    gc_twist_accumulate((long)&s.xd_tf[-1].angular_velocity + lVar4,
                        (long)&s.xd_jnt[-1].angular_velocity + lVar4,
                        (long)&(s.xd)->angular_velocity + lVar4);
    (**(code **)(&two_dof_robot_a + lVar3))
              (lVar6,(long)s.qdd + lVar5,(long)&s.xdd_jnt[-1].angular_acceleration + lVar4);
    (**(code **)(&two_dof_robot_c + lVar3))
              (lVar6,(long)&(s.xd)->angular_velocity + lVar4,(long)s.qd + lVar5,
               (long)&s.xdd_bias[-1].angular_acceleration + lVar4);
    gc_acc_twist_add((long)&s.xdd_jnt[-1].angular_acceleration + lVar4,
                     (long)&s.xdd_bias[-1].angular_acceleration + lVar4,
                     (long)&s.xdd_net[-1].angular_acceleration + lVar4);
    gc_acc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].rotation + lVar4,(long)&s.xdd[-1].angular_acceleration + lVar4,
               (long)&s.xdd_tf[-1].angular_acceleration + lVar4);
    gc_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].angular_acceleration + lVar4,
               (long)&s.xdd_net[-1].angular_acceleration + lVar4,
               (long)&(s.xdd)->angular_acceleration + lVar4);
    lVar4 = lVar4 + 0x10;
    lVar5 = lVar5 + 8;
    lVar2 = lVar2 + 0x90;
  }
  gc_acc_twist_log(s.xdd + s.nbody);
  return;
}

Assistant:

void fak_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.qdd[0] = 1.0;
    s.qdd[1] = 1.0;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}